

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evloop_epoll.c
# Opt level: O3

ev_impl * ev_epoll_open(void)

{
  int iVar1;
  ev_impl *__ptr;
  
  __ptr = (ev_impl *)malloc(4);
  iVar1 = epoll_create(0x80);
  __ptr->epollfd = iVar1;
  if (iVar1 == -1) {
    perror("epoll_create()");
    free(__ptr);
    __ptr = (ev_impl *)0x0;
  }
  return __ptr;
}

Assistant:

struct ev_impl * ev_epoll_open(void)
{
  struct ev_impl * impl = malloc(sizeof(struct ev_impl));
  impl->epollfd = epoll_create(128);
  if(impl->epollfd == -1)
    perror("epoll_create()");
  else
    return impl;
  free(impl);
  return NULL;
}